

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

int stbi__parse_png_file(stbi__png *z,int scan,int req_comp)

{
  stbi_uc *psVar1;
  stbi__uint32 x;
  stbi__uint32 y;
  stbi__context *s;
  stbi__context *psVar2;
  bool bVar3;
  uint len;
  bool bVar4;
  bool bVar5;
  stbi_uc **ppsVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  stbi_uc sVar11;
  byte bVar12;
  int iVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  uint color;
  stbi_uc *psVar20;
  stbi_uc *psVar21;
  byte *pbVar22;
  uint uVar23;
  size_t __n;
  ulong uVar24;
  byte bVar25;
  uint uVar26;
  uint uVar27;
  stbi_uc *psVar28;
  long lVar29;
  stbi__png *psVar30;
  long lVar31;
  size_t __size;
  long lVar32;
  uint uVar33;
  uint depth;
  ulong uVar34;
  bool bVar35;
  stbi_uc asStack_528 [8];
  stbi_uc palette [1024];
  ulong local_f0;
  stbi__uint32 local_a4;
  uint local_a0;
  stbi__uint32 raw_len;
  ulong local_98;
  stbi_uc **local_90;
  uint local_88;
  uint local_84;
  int local_80;
  uint local_7c;
  stbi_uc *local_78;
  int local_70;
  stbi_uc local_6b [3];
  stbi__png *psStack_68;
  stbi_uc tc [3];
  int local_34;
  
  s = z->s;
  z->idata = (stbi_uc *)0x0;
  z->expanded = (stbi_uc *)0x0;
  z->out = (stbi_uc *)0x0;
  local_a0 = req_comp;
  psStack_68 = z;
  iVar13 = stbi__check_png_header(s);
  if (iVar13 == 0) {
    local_34 = 0;
  }
  else {
    local_34 = 1;
    if (scan != 1) {
      local_90 = &psStack_68->idata;
      psVar1 = s->buffer_start;
      local_78 = s->buffer_start + 1;
      bVar12 = 0;
      bVar4 = true;
      color = 0;
      depth = 0;
      local_80 = 0;
      local_98 = 0;
      __size = 0;
      len = 0;
      bVar5 = false;
      bVar9 = 0;
      bVar8 = 0;
      local_70 = scan;
      do {
        iVar13 = stbi__get16be(s);
        uVar14 = stbi__get16be(s);
        uVar33 = iVar13 * 0x10000 + uVar14;
        uVar15 = stbi__get16be(s);
        uVar16 = stbi__get16be(s);
        ppsVar6 = local_90;
        uVar26 = uVar15 << 0x10 | uVar16;
        uVar23 = (uint)local_98;
        uVar27 = len;
        if ((int)uVar26 < 0x49484452) {
          if (uVar26 == 0x43674249) {
            local_80 = 1;
LAB_0011b983:
            stbi__skip(s,uVar33);
LAB_0011bb7f:
            stbi__get16be(s);
            stbi__get16be(s);
            bVar3 = true;
            len = uVar27;
          }
          else if (uVar26 == 0x49444154) {
            if (bVar4) {
LAB_0011ba14:
              stbi__g_failure_reason = "first not IHDR";
              bVar4 = true;
            }
            else {
              if ((bVar8 == 0) || (uVar23 != 0)) {
                if (local_70 == 2) {
                  s->img_n = (uint)bVar8;
                  local_34 = 1;
LAB_0011bbd6:
                  bVar4 = false;
                  goto LAB_0011c78c;
                }
                uVar27 = uVar33 + len;
                if ((int)len <= (int)uVar27) {
                  if ((uint)__size < uVar27) {
                    uVar24 = 0x1000;
                    if (0x1000 < uVar33) {
                      uVar24 = (ulong)uVar33;
                    }
                    if ((uint)__size != 0) {
                      uVar24 = __size;
                    }
                    do {
                      __size = uVar24;
                      uVar24 = (ulong)((uint)__size * 2);
                    } while ((uint)__size < uVar27);
                    psVar20 = (stbi_uc *)realloc(*local_90,__size);
                    if (psVar20 == (stbi_uc *)0x0) {
                      stbi__g_failure_reason = "outofmem";
                      local_34 = 0;
                      goto LAB_0011bbd6;
                    }
                    *ppsVar6 = psVar20;
                  }
                  iVar13 = stbi__getn(s,*local_90 + len,uVar33);
                  bVar4 = false;
                  if (iVar13 != 0) goto LAB_0011bb7f;
                  stbi__g_failure_reason = "outofdata";
                }
              }
              else {
                stbi__g_failure_reason = "no PLTE";
                local_98 = 0;
              }
LAB_0011bb00:
              bVar4 = false;
            }
            bVar3 = false;
            local_34 = 0;
          }
          else {
            if (uVar26 != 0x49454e44) {
LAB_0011b9ba:
              if (bVar4) goto LAB_0011ba14;
              bVar4 = false;
              if ((uVar15 >> 0xd & 1) == 0) {
                stbi__parse_png_file::invalid_chunk[0] = (char)(uVar26 >> 0x18);
                stbi__parse_png_file::invalid_chunk[1] = (char)(uVar26 >> 0x10);
                stbi__parse_png_file::invalid_chunk[2] = (char)(uVar16 >> 8);
                stbi__parse_png_file::invalid_chunk[3] = (char)uVar16;
                stbi__g_failure_reason = stbi__parse_png_file::invalid_chunk;
                goto LAB_0011bb00;
              }
              goto LAB_0011b983;
            }
            if (bVar4) {
              stbi__g_failure_reason = "first not IHDR";
LAB_0011b8bf:
              local_34 = 0;
            }
            else if (local_70 == 0) {
              if (*local_90 == (stbi_uc *)0x0) {
                stbi__g_failure_reason = "no IDAT";
                goto LAB_0011b8bf;
              }
              local_a4 = s->img_n * s->img_y * (s->img_x * depth + 7 >> 3) + s->img_y;
              psVar20 = (stbi_uc *)
                        stbi_zlib_decode_malloc_guesssize_headerflag
                                  ((char *)*local_90,len,local_a4,(int *)&local_a4,
                                   (uint)(local_80 == 0));
              ppsVar6 = local_90;
              uVar33 = local_a0;
              psStack_68->expanded = psVar20;
              local_34 = 0;
              if (psVar20 != (stbi_uc *)0x0) {
                bVar35 = local_a0 != 3;
                free(*local_90);
                *ppsVar6 = (stbi_uc *)0x0;
                uVar27 = s->img_n + 1;
                if (bVar5 || (bVar8 == 0 && bVar35) && uVar27 == uVar33) {
                  s->img_out_n = uVar27;
                }
                else {
                  s->img_out_n = s->img_n;
                }
                psVar20 = psStack_68->expanded;
                iVar13 = s->img_out_n;
                __n = (size_t)iVar13;
                x = psStack_68->s->img_x;
                y = psStack_68->s->img_y;
                if (bVar12 == 0) {
                  iVar13 = stbi__create_png_image_raw
                                     (psStack_68,psVar20,local_a4,iVar13,x,y,depth,color);
                  psVar30 = psStack_68;
                  if (iVar13 == 0) goto LAB_0011c78c;
                }
                else {
                  raw_len = local_a4;
                  psVar21 = (stbi_uc *)malloc((ulong)(x * iVar13 * y));
                  lVar31 = 0;
                  psVar30 = psStack_68;
                  do {
                    psVar2 = psVar30->s;
                    uVar33 = (&DAT_0012b390)[lVar31];
                    uVar27 = (&DAT_0012b3d0)[lVar31];
                    uVar26 = ~uVar33 + psVar2->img_x + uVar27;
                    local_88 = uVar26 / uVar27;
                    uVar14 = (&DAT_0012b3b0)[lVar31];
                    uVar15 = (&DAT_0012b3f0)[lVar31];
                    uVar23 = ~uVar14 + psVar2->img_y + uVar15;
                    uVar16 = uVar23 / uVar15;
                    bVar35 = true;
                    local_7c = uVar16;
                    if ((uVar27 <= uVar26) && (uVar15 <= uVar23)) {
                      iVar17 = local_88 * depth;
                      iVar19 = psVar2->img_n;
                      local_84 = uVar15;
                      iVar18 = stbi__create_png_image_raw
                                         (psVar30,psVar20,raw_len,iVar13,local_88,uVar16,depth,color
                                         );
                      if (iVar18 == 0) {
                        free(psVar21);
                        bVar35 = false;
                        psVar30 = psStack_68;
                      }
                      else {
                        if (0 < (int)uVar16) {
                          lVar29 = (long)(int)local_88;
                          uVar24 = (ulong)local_7c;
                          iVar18 = uVar14 * iVar13;
                          local_84 = local_84 * iVar13;
                          local_f0 = 0;
                          do {
                            if (0 < (int)local_88) {
                              psVar2 = psStack_68->s;
                              palette._1016_8_ = psStack_68->out;
                              lVar32 = 0;
                              psVar28 = psVar21 + (long)(int)uVar33 * __n;
                              do {
                                memcpy(psVar28 + psVar2->img_x * iVar18,
                                       (void *)((local_f0 * lVar29 + lVar32) * __n +
                                               palette._1016_8_),__n);
                                lVar32 = lVar32 + 1;
                                psVar28 = psVar28 + (long)(int)uVar27 * __n;
                              } while (lVar32 < lVar29);
                            }
                            local_f0 = local_f0 + 1;
                            iVar18 = iVar18 + local_84;
                          } while (local_f0 < uVar24);
                        }
                        psVar30 = psStack_68;
                        uVar33 = ((iVar17 * iVar19 + 7 >> 3) + 1) * local_7c;
                        free(psStack_68->out);
                        psVar20 = psVar20 + uVar33;
                        raw_len = raw_len - uVar33;
                        bVar35 = true;
                      }
                    }
                    if (!bVar35) goto LAB_0011c78c;
                    lVar31 = lVar31 + 1;
                  } while (lVar31 != 7);
                  psVar30->out = psVar21;
                }
                if (bVar5) {
                  psVar20 = psVar30->out;
                  iVar13 = psVar30->s->img_y * psVar30->s->img_x;
                  if (s->img_out_n == 2) {
                    if (iVar13 != 0) {
                      lVar31 = 0;
                      do {
                        psVar20[lVar31 * 2 + 1] = -(psVar20[lVar31 * 2] != local_6b[0]);
                        lVar31 = lVar31 + 1;
                      } while (iVar13 != (int)lVar31);
                    }
                  }
                  else {
                    if (s->img_out_n != 4) {
                      __assert_fail("out_n == 2 || out_n == 4",
                                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/3rdparty/stb_image.h"
                                    ,0x1059,
                                    "int stbi__compute_transparency(stbi__png *, stbi_uc *, int)");
                    }
                    if (iVar13 != 0) {
                      lVar31 = 0;
                      do {
                        if (((psVar20[lVar31 * 4] == local_6b[0]) &&
                            (psVar20[lVar31 * 4 + 1] == local_6b[1])) &&
                           (psVar20[lVar31 * 4 + 2] == local_6b[2])) {
                          psVar20[lVar31 * 4 + 3] = '\0';
                        }
                        lVar31 = lVar31 + 1;
                      } while (iVar13 != (int)lVar31);
                    }
                  }
                }
                if (((local_80 != 0) && (stbi__de_iphone_flag != 0)) && (2 < s->img_out_n)) {
                  stbi__de_iphone(psStack_68);
                }
                if (bVar8 != 0) {
                  s->img_n = (uint)bVar8;
                  uVar33 = (uint)bVar8;
                  if (2 < (int)local_a0) {
                    uVar33 = local_a0;
                  }
                  s->img_out_n = uVar33;
                  psVar20 = psStack_68->out;
                  uVar27 = psStack_68->s->img_y * psStack_68->s->img_x;
                  psVar21 = (stbi_uc *)malloc((ulong)(uVar27 * uVar33));
                  if (psVar21 == (stbi_uc *)0x0) {
                    stbi__g_failure_reason = "outofmem";
                  }
                  else {
                    if (uVar33 == 3) {
                      if (uVar27 != 0) {
                        uVar24 = 0;
                        psVar28 = psVar21;
                        do {
                          uVar34 = (ulong)psVar20[uVar24];
                          *psVar28 = asStack_528[uVar34 * 4];
                          psVar28[1] = asStack_528[uVar34 * 4 + 1];
                          psVar28[2] = asStack_528[uVar34 * 4 + 2];
                          psVar28 = psVar28 + 3;
                          uVar24 = uVar24 + 1;
                        } while (uVar27 != uVar24);
                      }
                    }
                    else if (uVar27 != 0) {
                      uVar24 = 0;
                      do {
                        uVar34 = (ulong)psVar20[uVar24];
                        psVar21[uVar24 * 4] = asStack_528[uVar34 * 4];
                        psVar21[uVar24 * 4 + 1] = asStack_528[uVar34 * 4 + 1];
                        psVar21[uVar24 * 4 + 2] = asStack_528[uVar34 * 4 + 2];
                        psVar21[uVar24 * 4 + 3] = asStack_528[uVar34 * 4 + 3];
                        uVar24 = uVar24 + 1;
                      } while (uVar27 != uVar24);
                    }
                    free(psVar20);
                    psStack_68->out = psVar21;
                  }
                  if (psVar21 == (stbi_uc *)0x0) goto LAB_0011c78c;
                }
                psVar30 = psStack_68;
                free(psStack_68->expanded);
                psVar30->expanded = (stbi_uc *)0x0;
                goto LAB_0011baaf;
              }
            }
            else {
LAB_0011baaf:
              local_34 = 1;
            }
LAB_0011c78c:
            bVar3 = false;
          }
        }
        else if (uVar26 == 0x74524e53) {
          if (bVar4) {
            stbi__g_failure_reason = "first not IHDR";
            bVar4 = true;
LAB_0011ba8d:
            local_34 = 0;
          }
          else {
            if (*local_90 != (stbi_uc *)0x0) {
              stbi__g_failure_reason = "tRNS after IDAT";
LAB_0011ba8b:
              bVar4 = false;
              goto LAB_0011ba8d;
            }
            if (bVar8 == 0) {
              if ((s->img_n & 1U) == 0) {
                stbi__g_failure_reason = "tRNS with alpha";
              }
              else {
                if (s->img_n * 2 == uVar33) {
                  bVar5 = true;
                  if (s->img_n < 1) {
                    bVar9 = 0;
                    bVar8 = 0;
                    goto LAB_0011bb4e;
                  }
                  lVar31 = 0;
                  do {
                    iVar13 = stbi__get16be(s);
                    local_6b[lVar31] = ""[depth] * (char)iVar13;
                    lVar31 = lVar31 + 1;
                  } while (lVar31 < s->img_n);
                  bVar9 = 0;
                  bVar10 = 0;
LAB_0011c7a3:
                  bVar8 = bVar10;
                  bVar4 = false;
                  goto LAB_0011bb7f;
                }
                stbi__g_failure_reason = "bad tRNS len";
              }
              bVar4 = false;
              bVar9 = 0;
              bVar8 = 0;
              goto LAB_0011bbad;
            }
            if (local_70 != 2) {
              if (uVar23 == 0) {
                stbi__g_failure_reason = "tRNS before PLTE";
                local_98 = 0;
              }
              else {
                if (uVar33 <= uVar23) {
                  bVar8 = 4;
                  bVar9 = 4;
                  bVar10 = 4;
                  if (uVar33 == 0) goto LAB_0011c7a3;
                  uVar24 = 0;
                  do {
                    psVar20 = s->img_buffer;
                    if (psVar20 < s->img_buffer_end) {
LAB_0011c40e:
                      s->img_buffer = psVar20 + 1;
                      sVar11 = *psVar20;
                    }
                    else {
                      if (s->read_from_callbacks != 0) {
                        iVar19 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
                        if (iVar19 == 0) {
                          s->read_from_callbacks = 0;
                          s->img_buffer = psVar1;
                          s->img_buffer_end = local_78;
                          s->buffer_start[0] = '\0';
                        }
                        else {
                          s->img_buffer = psVar1;
                          s->img_buffer_end = psVar1 + iVar19;
                        }
                        psVar20 = s->img_buffer;
                        goto LAB_0011c40e;
                      }
                      sVar11 = '\0';
                    }
                    asStack_528[uVar24 * 4 + 3] = sVar11;
                    uVar24 = uVar24 + 1;
                  } while (uVar14 + iVar13 * 0x10000 != uVar24);
LAB_0011bb4e:
                  bVar4 = false;
                  goto LAB_0011bb7f;
                }
                stbi__g_failure_reason = "bad tRNS len";
              }
              goto LAB_0011ba8b;
            }
            s->img_n = 4;
            local_34 = 1;
            bVar4 = false;
          }
          bVar3 = false;
        }
        else {
          if (uVar26 == 0x504c5445) {
            if (bVar4) {
              stbi__g_failure_reason = "first not IHDR";
              bVar4 = true;
            }
            else {
              if ((uVar33 < 0x301) &&
                 (uVar24 = (ulong)uVar14 * 0x55555556 >> 0x20, local_98 = uVar24,
                 (int)((ulong)uVar14 * 0x55555556 >> 0x20) * 3 == uVar33)) {
                if (2 < uVar14) {
                  uVar34 = 0;
                  do {
                    psVar20 = s->img_buffer;
                    if (psVar20 < s->img_buffer_end) {
LAB_0011be54:
                      s->img_buffer = psVar20 + 1;
                      sVar11 = *psVar20;
                    }
                    else {
                      if (s->read_from_callbacks != 0) {
                        iVar13 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
                        if (iVar13 == 0) {
                          s->read_from_callbacks = 0;
                          s->img_buffer = psVar1;
                          s->img_buffer_end = local_78;
                          s->buffer_start[0] = '\0';
                        }
                        else {
                          s->img_buffer = psVar1;
                          s->img_buffer_end = psVar1 + iVar13;
                        }
                        psVar20 = s->img_buffer;
                        goto LAB_0011be54;
                      }
                      sVar11 = '\0';
                    }
                    asStack_528[uVar34 * 4] = sVar11;
                    psVar20 = s->img_buffer;
                    if (psVar20 < s->img_buffer_end) {
LAB_0011bed2:
                      s->img_buffer = psVar20 + 1;
                      sVar11 = *psVar20;
                    }
                    else {
                      if (s->read_from_callbacks != 0) {
                        iVar13 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
                        if (iVar13 == 0) {
                          s->read_from_callbacks = 0;
                          s->img_buffer = psVar1;
                          s->img_buffer_end = local_78;
                          s->buffer_start[0] = '\0';
                        }
                        else {
                          s->img_buffer = psVar1;
                          s->img_buffer_end = psVar1 + iVar13;
                        }
                        psVar20 = s->img_buffer;
                        goto LAB_0011bed2;
                      }
                      sVar11 = '\0';
                    }
                    asStack_528[uVar34 * 4 + 1] = sVar11;
                    psVar20 = s->img_buffer;
                    if (psVar20 < s->img_buffer_end) {
LAB_0011bf50:
                      s->img_buffer = psVar20 + 1;
                      sVar11 = *psVar20;
                    }
                    else {
                      if (s->read_from_callbacks != 0) {
                        iVar13 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
                        if (iVar13 == 0) {
                          s->read_from_callbacks = 0;
                          s->img_buffer = psVar1;
                          s->img_buffer_end = local_78;
                          s->buffer_start[0] = '\0';
                        }
                        else {
                          s->img_buffer = psVar1;
                          s->img_buffer_end = psVar1 + iVar13;
                        }
                        psVar20 = s->img_buffer;
                        goto LAB_0011bf50;
                      }
                      sVar11 = '\0';
                    }
                    asStack_528[uVar34 * 4 + 2] = sVar11;
                    asStack_528[uVar34 * 4 + 3] = 0xff;
                    uVar34 = uVar34 + 1;
                    bVar10 = bVar8;
                  } while (uVar24 != uVar34);
                  goto LAB_0011c7a3;
                }
                goto LAB_0011bb4e;
              }
              stbi__g_failure_reason = "invalid PLTE";
              bVar4 = false;
            }
LAB_0011bbad:
            bVar3 = false;
            local_34 = 0;
            goto LAB_0011c78e;
          }
          if (uVar26 != 0x49484452) goto LAB_0011b9ba;
          if (bVar4) {
            if (uVar33 != 0xd) {
              stbi__g_failure_reason = "bad IHDR len";
              goto LAB_0011bb64;
            }
            iVar13 = stbi__get16be(s);
            uVar33 = stbi__get16be(s);
            uVar33 = uVar33 | iVar13 << 0x10;
            s->img_x = uVar33;
            if (0x1000000 < uVar33) {
LAB_0011b964:
              stbi__g_failure_reason = "too large";
              goto LAB_0011bb64;
            }
            iVar13 = stbi__get16be(s);
            uVar33 = stbi__get16be(s);
            uVar33 = uVar33 | iVar13 << 0x10;
            s->img_y = uVar33;
            if (0x1000000 < uVar33) goto LAB_0011b964;
            pbVar22 = s->img_buffer;
            if (pbVar22 < s->img_buffer_end) {
LAB_0011c55a:
              s->img_buffer = pbVar22 + 1;
              bVar10 = *pbVar22;
            }
            else {
              if (s->read_from_callbacks != 0) {
                iVar13 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
                if (iVar13 == 0) {
                  s->read_from_callbacks = 0;
                  s->img_buffer = psVar1;
                  s->img_buffer_end = local_78;
                  s->buffer_start[0] = '\0';
                }
                else {
                  s->img_buffer = psVar1;
                  s->img_buffer_end = psVar1 + iVar13;
                }
                pbVar22 = s->img_buffer;
                goto LAB_0011c55a;
              }
              bVar10 = 0;
            }
            depth = (uint)bVar10;
            if ((8 < bVar10) || ((0x116U >> (bVar10 & 0x1f) & 1) == 0)) {
              stbi__g_failure_reason = "1/2/4/8-bit only";
              goto LAB_0011bb64;
            }
            pbVar22 = s->img_buffer;
            if (pbVar22 < s->img_buffer_end) {
LAB_0011c666:
              s->img_buffer = pbVar22 + 1;
              bVar10 = *pbVar22;
            }
            else {
              if (s->read_from_callbacks != 0) {
                iVar13 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
                if (iVar13 == 0) {
                  s->read_from_callbacks = 0;
                  s->img_buffer = psVar1;
                  s->img_buffer_end = local_78;
                  s->buffer_start[0] = '\0';
                }
                else {
                  s->img_buffer = psVar1;
                  s->img_buffer_end = psVar1 + iVar13;
                }
                pbVar22 = s->img_buffer;
                goto LAB_0011c666;
              }
              bVar10 = 0;
            }
            color = (uint)bVar10;
            if (bVar10 < 7) {
              bVar25 = 3;
              bVar7 = 3;
              if ((bVar10 != 3) && (bVar25 = bVar8, bVar7 = bVar9, (bVar10 & 1) != 0))
              goto LAB_0011c686;
              bVar8 = bVar7;
              psVar20 = s->img_buffer;
              bVar9 = bVar8;
              if (psVar20 < s->img_buffer_end) {
LAB_0011c7e8:
                s->img_buffer = psVar20 + 1;
                if (*psVar20 == '\0') goto LAB_0011c80c;
                stbi__g_failure_reason = "bad comp method";
                goto LAB_0011c850;
              }
              if (s->read_from_callbacks != 0) {
                iVar13 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
                if (iVar13 == 0) {
                  s->read_from_callbacks = 0;
                  s->img_buffer = psVar1;
                  s->img_buffer_end = local_78;
                  s->buffer_start[0] = '\0';
                }
                else {
                  s->img_buffer = psVar1;
                  s->img_buffer_end = psVar1 + iVar13;
                }
                psVar20 = s->img_buffer;
                bVar25 = bVar8;
                goto LAB_0011c7e8;
              }
LAB_0011c80c:
              sVar11 = stbi__get8(s);
              if (sVar11 != '\0') {
                stbi__g_failure_reason = "bad filter method";
                bVar25 = bVar8;
                goto LAB_0011c850;
              }
              bVar12 = stbi__get8(s);
              if (1 < bVar12) {
                stbi__g_failure_reason = "bad interlace method";
                bVar25 = bVar8;
                goto LAB_0011c850;
              }
              uVar33 = s->img_x;
              if ((uVar33 == 0) || (uVar14 = s->img_y, uVar14 == 0)) {
                stbi__g_failure_reason = "0-pixel image";
                bVar25 = bVar8;
                goto LAB_0011c850;
              }
              if (bVar8 == 0) {
                uVar15 = (uint)(3 < bVar10) + (bVar10 & 2) + 1;
                s->img_n = uVar15;
                if ((uint)((0x40000000 / (ulong)uVar33) / (ulong)uVar15) < uVar14) {
                  stbi__g_failure_reason = "too large";
                  bVar25 = 0;
                  bVar9 = 0;
                  goto LAB_0011c850;
                }
                if (local_70 != 2) goto LAB_0011c92d;
                local_34 = 1;
                bVar35 = false;
                bVar9 = 0;
                bVar8 = 0;
              }
              else {
                s->img_n = 1;
                if ((uint)(0x40000000 / (ulong)uVar33 >> 2) < uVar14) {
                  stbi__g_failure_reason = "too large";
                  goto LAB_0011bb64;
                }
LAB_0011c92d:
                bVar35 = true;
              }
            }
            else {
LAB_0011c686:
              stbi__g_failure_reason = "bad ctype";
              bVar25 = bVar8;
LAB_0011c850:
              bVar35 = false;
              local_34 = 0;
              bVar8 = bVar25;
            }
          }
          else {
            stbi__g_failure_reason = "multiple IHDR";
LAB_0011bb64:
            bVar35 = false;
            local_34 = 0;
          }
          bVar4 = false;
          bVar3 = false;
          if (bVar35) goto LAB_0011bb7f;
        }
LAB_0011c78e:
      } while (bVar3);
    }
  }
  return local_34;
}

Assistant:

static int stbi__parse_png_file(stbi__png *z, int scan, int req_comp)
{
   stbi_uc palette[1024], pal_img_n=0;
   stbi_uc has_trans=0, tc[3];
   stbi__uint32 ioff=0, idata_limit=0, i, pal_len=0;
   int first=1,k,interlace=0, color=0, depth=0, is_iphone=0;
   stbi__context *s = z->s;

   z->expanded = NULL;
   z->idata = NULL;
   z->out = NULL;

   if (!stbi__check_png_header(s)) return 0;

   if (scan == STBI__SCAN_type) return 1;

   for (;;) {
      stbi__pngchunk c = stbi__get_chunk_header(s);
      switch (c.type) {
         case STBI__PNG_TYPE('C','g','B','I'):
            is_iphone = 1;
            stbi__skip(s, c.length);
            break;
         case STBI__PNG_TYPE('I','H','D','R'): {
            int comp,filter;
            if (!first) return stbi__err("multiple IHDR","Corrupt PNG");
            first = 0;
            if (c.length != 13) return stbi__err("bad IHDR len","Corrupt PNG");
            s->img_x = stbi__get32be(s); if (s->img_x > (1 << 24)) return stbi__err("too large","Very large image (corrupt?)");
            s->img_y = stbi__get32be(s); if (s->img_y > (1 << 24)) return stbi__err("too large","Very large image (corrupt?)");
            depth = stbi__get8(s);  if (depth != 1 && depth != 2 && depth != 4 && depth != 8)  return stbi__err("1/2/4/8-bit only","PNG not supported: 1/2/4/8-bit only");
            color = stbi__get8(s);  if (color > 6)         return stbi__err("bad ctype","Corrupt PNG");
            if (color == 3) pal_img_n = 3; else if (color & 1) return stbi__err("bad ctype","Corrupt PNG");
            comp  = stbi__get8(s);  if (comp) return stbi__err("bad comp method","Corrupt PNG");
            filter= stbi__get8(s);  if (filter) return stbi__err("bad filter method","Corrupt PNG");
            interlace = stbi__get8(s); if (interlace>1) return stbi__err("bad interlace method","Corrupt PNG");
            if (!s->img_x || !s->img_y) return stbi__err("0-pixel image","Corrupt PNG");
            if (!pal_img_n) {
               s->img_n = (color & 2 ? 3 : 1) + (color & 4 ? 1 : 0);
               if ((1 << 30) / s->img_x / s->img_n < s->img_y) return stbi__err("too large", "Image too large to decode");
               if (scan == STBI__SCAN_header) return 1;
            } else {
               // if paletted, then pal_n is our final components, and
               // img_n is # components to decompress/filter.
               s->img_n = 1;
               if ((1 << 30) / s->img_x / 4 < s->img_y) return stbi__err("too large","Corrupt PNG");
               // if SCAN_header, have to scan to see if we have a tRNS
            }
            break;
         }

         case STBI__PNG_TYPE('P','L','T','E'):  {
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (c.length > 256*3) return stbi__err("invalid PLTE","Corrupt PNG");
            pal_len = c.length / 3;
            if (pal_len * 3 != c.length) return stbi__err("invalid PLTE","Corrupt PNG");
            for (i=0; i < pal_len; ++i) {
               palette[i*4+0] = stbi__get8(s);
               palette[i*4+1] = stbi__get8(s);
               palette[i*4+2] = stbi__get8(s);
               palette[i*4+3] = 255;
            }
            break;
         }

         case STBI__PNG_TYPE('t','R','N','S'): {
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (z->idata) return stbi__err("tRNS after IDAT","Corrupt PNG");
            if (pal_img_n) {
               if (scan == STBI__SCAN_header) { s->img_n = 4; return 1; }
               if (pal_len == 0) return stbi__err("tRNS before PLTE","Corrupt PNG");
               if (c.length > pal_len) return stbi__err("bad tRNS len","Corrupt PNG");
               pal_img_n = 4;
               for (i=0; i < c.length; ++i)
                  palette[i*4+3] = stbi__get8(s);
            } else {
               if (!(s->img_n & 1)) return stbi__err("tRNS with alpha","Corrupt PNG");
               if (c.length != (stbi__uint32) s->img_n*2) return stbi__err("bad tRNS len","Corrupt PNG");
               has_trans = 1;
               for (k=0; k < s->img_n; ++k)
                  tc[k] = (stbi_uc) (stbi__get16be(s) & 255) * stbi__depth_scale_table[depth]; // non 8-bit images will be larger
            }
            break;
         }

         case STBI__PNG_TYPE('I','D','A','T'): {
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (pal_img_n && !pal_len) return stbi__err("no PLTE","Corrupt PNG");
            if (scan == STBI__SCAN_header) { s->img_n = pal_img_n; return 1; }
            if ((int)(ioff + c.length) < (int)ioff) return 0;
            if (ioff + c.length > idata_limit) {
               stbi_uc *p;
               if (idata_limit == 0) idata_limit = c.length > 4096 ? c.length : 4096;
               while (ioff + c.length > idata_limit)
                  idata_limit *= 2;
               p = (stbi_uc *) STBI_REALLOC(z->idata, idata_limit); if (p == NULL) return stbi__err("outofmem", "Out of memory");
               z->idata = p;
            }
            if (!stbi__getn(s, z->idata+ioff,c.length)) return stbi__err("outofdata","Corrupt PNG");
            ioff += c.length;
            break;
         }

         case STBI__PNG_TYPE('I','E','N','D'): {
            stbi__uint32 raw_len, bpl;
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (scan != STBI__SCAN_load) return 1;
            if (z->idata == NULL) return stbi__err("no IDAT","Corrupt PNG");
            // initial guess for decoded data size to avoid unnecessary reallocs
            bpl = (s->img_x * depth + 7) / 8; // bytes per line, per component
            raw_len = bpl * s->img_y * s->img_n /* pixels */ + s->img_y /* filter mode per row */;
            z->expanded = (stbi_uc *) stbi_zlib_decode_malloc_guesssize_headerflag((char *) z->idata, ioff, raw_len, (int *) &raw_len, !is_iphone);
            if (z->expanded == NULL) return 0; // zlib should set error
            STBI_FREE(z->idata); z->idata = NULL;
            if ((req_comp == s->img_n+1 && req_comp != 3 && !pal_img_n) || has_trans)
               s->img_out_n = s->img_n+1;
            else
               s->img_out_n = s->img_n;
            if (!stbi__create_png_image(z, z->expanded, raw_len, s->img_out_n, depth, color, interlace)) return 0;
            if (has_trans)
               if (!stbi__compute_transparency(z, tc, s->img_out_n)) return 0;
            if (is_iphone && stbi__de_iphone_flag && s->img_out_n > 2)
               stbi__de_iphone(z);
            if (pal_img_n) {
               // pal_img_n == 3 or 4
               s->img_n = pal_img_n; // record the actual colors we had
               s->img_out_n = pal_img_n;
               if (req_comp >= 3) s->img_out_n = req_comp;
               if (!stbi__expand_png_palette(z, palette, pal_len, s->img_out_n))
                  return 0;
            }
            STBI_FREE(z->expanded); z->expanded = NULL;
            return 1;
         }

         default:
            // if critical, fail
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if ((c.type & (1 << 29)) == 0) {
               #ifndef STBI_NO_FAILURE_STRINGS
               // not threadsafe
               static char invalid_chunk[] = "XXXX PNG chunk not known";
               invalid_chunk[0] = STBI__BYTECAST(c.type >> 24);
               invalid_chunk[1] = STBI__BYTECAST(c.type >> 16);
               invalid_chunk[2] = STBI__BYTECAST(c.type >>  8);
               invalid_chunk[3] = STBI__BYTECAST(c.type >>  0);
               #endif
               return stbi__err(invalid_chunk, "PNG not supported: unknown PNG chunk type");
            }
            stbi__skip(s, c.length);
            break;
      }
      // end of PNG chunk, read and skip CRC
      stbi__get32be(s);
   }
}